

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult cmCMakePresetsGraphInternal::PresetOptionalIntHelper(optional<int> *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  
  if (PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::
                                 helper);
    if (iVar2 != 0) {
      PresetOptionalIntHelper::helper.super__Function_base._M_functor._M_unused._M_object =
           (void *)0x0;
      PresetOptionalIntHelper::helper.super__Function_base._M_functor._8_8_ = PresetIntHelper;
      PresetOptionalIntHelper::helper._M_invoker =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::optional<int>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:281:12)>
           ::_M_invoke;
      PresetOptionalIntHelper::helper.super__Function_base._M_manager =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::optional<int>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:281:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetOptionalIntHelper::helper,
                   &__dso_handle);
      __cxa_guard_release(&PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::helper);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::optional<int>_&,_const_Json::Value_*)>
          ::operator()(&PresetOptionalIntHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalIntHelper(
  cm::optional<int>& out, const Json::Value* value)
{
  static auto const helper =
    JSONHelperBuilder::Optional<int>(ReadFileResult::READ_OK, PresetIntHelper);

  return helper(out, value);
}